

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpx_helper.c
# Opt level: O0

void helper_bndstx64_x86_64
               (CPUX86State *env,target_ulong base,target_ulong ptr,uint64_t lb,uint64_t ub)

{
  uint64_t ptr_00;
  uintptr_t unaff_retaddr;
  uint64_t bte;
  uintptr_t ra;
  uint64_t ub_local;
  uint64_t lb_local;
  target_ulong ptr_local;
  target_ulong base_local;
  CPUX86State *env_local;
  
  ptr_00 = lookup_bte64(env,base,unaff_retaddr);
  cpu_stq_data_ra_x86_64(env,ptr_00,lb,unaff_retaddr);
  cpu_stq_data_ra_x86_64(env,ptr_00 + 8,ub,unaff_retaddr);
  cpu_stq_data_ra_x86_64(env,ptr_00 + 0x10,ptr,unaff_retaddr);
  return;
}

Assistant:

void helper_bndstx64(CPUX86State *env, target_ulong base, target_ulong ptr,
                     uint64_t lb, uint64_t ub)
{
    uintptr_t ra = GETPC();
    uint64_t bte;

    bte = lookup_bte64(env, base, ra);
    cpu_stq_data_ra(env, bte, lb, ra);
    cpu_stq_data_ra(env, bte + 8, ub, ra);
    cpu_stq_data_ra(env, bte + 16, ptr, ra);
}